

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::Proxy_Function_Base::operator()
          (Proxy_Function_Base *this,Function_Params *params,Type_Conversions_State *t_conversions)

{
  arity_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  
  if ((-1 < (long)*(int *)&params[2].m_begin) &&
     ((long)(t_conversions->m_saves)._M_data - (long)(t_conversions->m_conversions)._M_data >> 4 !=
      (long)*(int *)&params[2].m_begin)) {
    this_00 = (arity_error *)__cxa_allocate_exception(0x18);
    exception::arity_error::arity_error
              (this_00,(int)((ulong)((long)(t_conversions->m_saves)._M_data -
                                    (long)(t_conversions->m_conversions)._M_data) >> 4),
               *(int *)&params[2].m_begin);
    __cxa_throw(this_00,&exception::arity_error::typeinfo,std::range_error::~range_error);
  }
  (*(code *)params->m_begin[3].m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)(this,params,t_conversions);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value operator()(const Function_Params &params, const chaiscript::Type_Conversions_State &t_conversions) const {
        if (m_arity < 0 || size_t(m_arity) == params.size()) {
          return do_call(params, t_conversions);
        } else {
          throw exception::arity_error(static_cast<int>(params.size()), m_arity);
        }
      }